

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

bool __thiscall CppJieba::MixSegment::dispose(MixSegment *this)

{
  if ((this->super_SegmentBase)._isInited == true) {
    MPSegment::dispose(&this->_mpSeg);
    (this->_hmmSeg).super_SegmentBase._isInited = false;
    (this->super_SegmentBase)._isInited = false;
  }
  return true;
}

Assistant:

virtual bool dispose()
            {
                if(!_getInitFlag())
                {
                    return true;
                }
                _mpSeg.dispose();
                _hmmSeg.dispose();
                _setInitFlag(false);
                return true;
            }